

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

void roaring64_bitmap_add_bulk(roaring64_bitmap_t *r,roaring64_bulk_context_t *context,uint64_t val)

{
  uint8_t uVar1;
  int iVar2;
  leaf_t *leaf_00;
  leaf_t *plVar3;
  leaf_t *in_RSI;
  undefined8 in_RDI;
  container_t *container2;
  roaring64_bitmap_t *in_stack_00000008;
  uint8_t typecode2;
  container_t *container1;
  uint8_t typecode1;
  leaf_t *leaf;
  uint16_t low16;
  uint8_t high48 [6];
  art_t *in_stack_ffffffffffffffb8;
  roaring64_bitmap_t *in_stack_ffffffffffffffc0;
  undefined5 in_stack_ffffffffffffffd0;
  uint8_t in_stack_ffffffffffffffd5;
  undefined1 in_stack_ffffffffffffffd6;
  undefined4 local_1e;
  undefined2 local_1a;
  uint16_t low16_00;
  
  low16_00 = (uint16_t)((ulong)in_RDI >> 0x30);
  split_key((uint64_t)in_stack_ffffffffffffffc0,(uint8_t *)in_stack_ffffffffffffffb8);
  plVar3 = (leaf_t *)in_RSI[1];
  if ((plVar3 == (leaf_t *)0x0) ||
     (iVar2 = compare_high48((art_key_chunk_t *)in_stack_ffffffffffffffc0,
                             (art_key_chunk_t *)in_stack_ffffffffffffffb8), iVar2 != 0)) {
    art_find(in_stack_ffffffffffffffb8,(art_key_chunk_t *)0x11cde0);
    plVar3 = containerptr_roaring64_bitmap_add
                       (in_stack_00000008,(uint8_t *)container2,low16_00,in_RSI);
    in_RSI[1] = (leaf_t)plVar3;
    *(undefined4 *)in_RSI = local_1e;
    *(undefined2 *)((long)in_RSI + 4) = local_1a;
  }
  else {
    uVar1 = get_typecode(*plVar3);
    leaf_00 = (leaf_t *)get_container(in_stack_ffffffffffffffc0,(leaf_t)in_stack_ffffffffffffffb8);
    plVar3 = (leaf_t *)
             container_add(plVar3,CONCAT11(uVar1,in_stack_ffffffffffffffd6),
                           in_stack_ffffffffffffffd5,(uint8_t *)leaf_00);
    if (plVar3 != leaf_00) {
      container_free(in_stack_ffffffffffffffc0,(uint8_t)((ulong)plVar3 >> 0x38));
      replace_container((roaring64_bitmap_t *)
                        CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffd6,
                                                CONCAT15(in_stack_ffffffffffffffd5,
                                                         in_stack_ffffffffffffffd0))),leaf_00,
                        in_stack_ffffffffffffffc0,(uint8_t)((ulong)plVar3 >> 0x38));
    }
  }
  return;
}

Assistant:

void roaring64_bitmap_add_bulk(roaring64_bitmap_t *r,
                               roaring64_bulk_context_t *context,
                               uint64_t val) {
    uint8_t high48[ART_KEY_BYTES];
    uint16_t low16 = split_key(val, high48);
    leaf_t *leaf = context->leaf;
    if (leaf != NULL && compare_high48(context->high_bytes, high48) == 0) {
        // We're at a container with the correct high bits.
        uint8_t typecode1 = get_typecode(*leaf);
        container_t *container1 = get_container(r, *leaf);
        uint8_t typecode2;
        container_t *container2 =
            container_add(container1, low16, typecode1, &typecode2);
        if (container2 != container1) {
            container_free(container1, typecode1);
            replace_container(r, leaf, container2, typecode2);
        }
    } else {
        // We're not positioned anywhere yet or the high bits of the key
        // differ.
        leaf = (leaf_t *)art_find(&r->art, high48);
        context->leaf =
            containerptr_roaring64_bitmap_add(r, high48, low16, leaf);
        memcpy(context->high_bytes, high48, ART_KEY_BYTES);
    }
}